

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O1

void __thiscall arangodb::velocypack::Builder::reportAdd(Builder *this)

{
  iterator __position;
  unsigned_long local_18;
  
  if ((this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage ==
      (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&this->_indexes,8);
  }
  local_18 = this->_pos -
             (this->_stack).
             super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].startPos;
  __position._M_current =
       (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->_indexes,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void Builder::reportAdd() {
  VELOCYPACK_ASSERT(!_stack.empty());
  if (_indexes.capacity() == 0) {
    // make an initial reservation for several items at
    // a time, in order to save frequent reallocations for
    // the first few attributes
    _indexes.reserve(8);
  }
  _indexes.push_back(_pos - _stack.back().startPos);
}